

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

int precallC(lua_State *L,StkId func,int nresults,lua_CFunction f)

{
  long lVar1;
  int nres;
  CallInfo *ci_00;
  int narg;
  ptrdiff_t t__;
  CallInfo *ci;
  int n;
  lua_CFunction f_local;
  StkId pSStack_18;
  int nresults_local;
  StkId func_local;
  lua_State *L_local;
  
  pSStack_18 = func;
  if ((long)(L->stack_last).p - (L->top).offset >> 4 < 0x15) {
    lVar1 = (L->stack).offset;
    if (0 < L->l_G->GCdebt) {
      luaC_step(L);
    }
    luaD_growstack(L,0x14,1);
    pSStack_18 = (StkId)((long)(L->stack).p + ((long)func - lVar1));
  }
  ci_00 = prepCallInfo(L,pSStack_18,nresults,2,(StkId)((L->top).offset + 0x140));
  L->ci = ci_00;
  if ((L->hookmask & 1U) != 0) {
    luaD_hook(L,0,-1,1,(int)((long)(L->top).p - (long)pSStack_18 >> 4) + -1);
  }
  nres = (*f)(L);
  luaD_poscall(L,ci_00,nres);
  return nres;
}

Assistant:

l_sinline int precallC (lua_State *L, StkId func, int nresults,
                                            lua_CFunction f) {
  int n;  /* number of returns */
  CallInfo *ci;
  checkstackGCp(L, LUA_MINSTACK, func);  /* ensure minimum stack size */
  L->ci = ci = prepCallInfo(L, func, nresults, CIST_C,
                               L->top.p + LUA_MINSTACK);
  lua_assert(ci->top.p <= L->stack_last.p);
  if (l_unlikely(L->hookmask & LUA_MASKCALL)) {
    int narg = cast_int(L->top.p - func) - 1;
    luaD_hook(L, LUA_HOOKCALL, -1, 1, narg);
  }
  lua_unlock(L);
  n = (*f)(L);  /* do the actual call */
  lua_lock(L);
  api_checknelems(L, n);
  luaD_poscall(L, ci, n);
  return n;
}